

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O2

void __thiscall
mjs::gc_vector<mjs::object::property>::erase(gc_vector<mjs::object::property> *this,property *elem)

{
  gc_table *pgVar1;
  property *ppVar2;
  
  pgVar1 = tab(this);
  if (pgVar1 + 1 <= elem) {
    ppVar2 = end(this);
    if (elem < ppVar2) {
      pgVar1 = tab(this);
      erase(this,(uint32_t)((ulong)((long)elem + (-0x10 - (long)pgVar1)) >> 4));
      return;
    }
  }
  __assert_fail("elem >= begin() && elem < end()",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h",
                0x3a,
                "void mjs::gc_vector<mjs::object::property>::erase(T *) [T = mjs::object::property]"
               );
}

Assistant:

void erase(T* elem) {
        assert(elem >= begin() && elem < end());
        erase(static_cast<uint32_t>(elem - begin()));
    }